

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall duckdb::Appender::AddColumn(Appender *this,string *name)

{
  size_t __n;
  pointer pLVar1;
  iterator __position;
  Allocator *allocator_p;
  Appender *pAVar2;
  bool bVar3;
  int iVar4;
  pointer pTVar5;
  reference this_00;
  string *psVar6;
  LogicalIndex LVar7;
  LogicalType *__x;
  idx_t extraout_RAX;
  ColumnDataCollection *this_01;
  InvalidInputException *pIVar8;
  size_type __n_00;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_02
  ;
  vector<duckdb::LogicalType,_true> *__x_00;
  pointer pLVar9;
  bool bVar10;
  string local_78;
  Appender *local_58;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
  *local_50;
  vector<duckdb::LogicalType,_true> *local_48;
  ulong local_40;
  vector<duckdb::LogicalIndex,_true> *local_38;
  
  BaseAppender::Flush(&this->super_BaseAppender);
  this_02 = &this->description;
  pTVar5 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_02);
  if ((pTVar5->columns).
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (pTVar5->columns).
      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_38 = &this->column_ids;
    local_48 = &(this->super_BaseAppender).active_types;
    local_40 = 0;
    __n_00 = 0;
    local_58 = this;
    local_50 = this_02;
    do {
      pTVar5 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
               ::operator->(this_02);
      this_00 = vector<duckdb::ColumnDefinition,_true>::operator[](&pTVar5->columns,__n_00);
      psVar6 = ColumnDefinition::Name_abi_cxx11_(this_00);
      __n = psVar6->_M_string_length;
      bVar10 = true;
      if (__n == name->_M_string_length) {
        if (__n == 0) {
          bVar10 = false;
        }
        else {
          iVar4 = bcmp((psVar6->_M_dataplus)._M_p,(name->_M_dataplus)._M_p,__n);
          bVar10 = iVar4 != 0;
        }
      }
      if (!bVar10) {
        bVar3 = ColumnDefinition::Generated(this_00);
        if (bVar3) {
          pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
          local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_78,"cannot add a generated column to the appender","");
          InvalidInputException::InvalidInputException(pIVar8,&local_78);
          __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
        }
        pLVar1 = (local_58->column_ids).
                 super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        for (pLVar9 = (local_58->column_ids).
                      super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
                      super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>
                      ._M_impl.super__Vector_impl_data._M_start; pLVar9 != pLVar1;
            pLVar9 = pLVar9 + 1) {
          LVar7 = ColumnDefinition::Logical(this_00);
          if (pLVar9->index == LVar7.index) {
            pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
            local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,"cannot add the same column twice","");
            InvalidInputException::InvalidInputException(pIVar8,&local_78);
            __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error
                       );
          }
        }
        __x = ColumnDefinition::Type(this_00);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&local_48->
                    super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,__x);
        LVar7 = ColumnDefinition::Logical(this_00);
        __position._M_current =
             (local_58->column_ids).
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_78._M_dataplus._M_p = (pointer)LVar7;
        if (__position._M_current ==
            (local_58->column_ids).
            super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
            super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
          _M_realloc_insert<duckdb::LogicalIndex>
                    (&local_38->
                      super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,
                     __position,(LogicalIndex *)&local_78);
          LVar7.index = extraout_RAX;
        }
        else {
          (__position._M_current)->index = LVar7.index;
          (local_58->column_ids).
          super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
          super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        local_40 = CONCAT71((int7)(LVar7.index >> 8),1);
        this_02 = local_50;
      }
      if (!bVar10) break;
      __n_00 = __n_00 + 1;
      pTVar5 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
               ::operator->(this_02);
    } while (__n_00 < (ulong)(((long)(pTVar5->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(pTVar5->columns).
                                     super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     .
                                     super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x7b425ed097b425ed));
    pAVar2 = local_58;
    if ((local_40 & 1) != 0) {
      BaseAppender::InitializeChunk(&local_58->super_BaseAppender);
      allocator_p = (pAVar2->super_BaseAppender).allocator;
      __x_00 = local_48;
      if ((pAVar2->super_BaseAppender).active_types.
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (pAVar2->super_BaseAppender).active_types.
          super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
          super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        __x_00 = &(pAVar2->super_BaseAppender).types;
      }
      this_01 = (ColumnDataCollection *)operator_new(0x70);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78,
                 &__x_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
      ColumnDataCollection::ColumnDataCollection
                (this_01,allocator_p,(vector<duckdb::LogicalType,_true> *)&local_78);
      ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
                ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&local_78);
      ::std::
      __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
      ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
               *)&(pAVar2->super_BaseAppender).collection,this_01);
      return;
    }
  }
  pIVar8 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"the column must exist in the table","");
  InvalidInputException::InvalidInputException(pIVar8,&local_78);
  __cxa_throw(pIVar8,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Appender::AddColumn(const string &name) {
	Flush();

	auto exists = false;
	for (idx_t col_idx = 0; col_idx < description->columns.size(); col_idx++) {
		auto &col_def = description->columns[col_idx];
		if (col_def.Name() != name) {
			continue;
		}

		// Ensure that we are not adding a generated column.
		if (col_def.Generated()) {
			throw InvalidInputException("cannot add a generated column to the appender");
		}

		// Ensure that we haven't added this column before.
		for (const auto &column_id : column_ids) {
			if (column_id == col_def.Logical()) {
				throw InvalidInputException("cannot add the same column twice");
			}
		}

		active_types.push_back(col_def.Type());
		column_ids.push_back(col_def.Logical());
		exists = true;
		break;
	}
	if (!exists) {
		throw InvalidInputException("the column must exist in the table");
	}

	InitializeChunk();
	collection = make_uniq<ColumnDataCollection>(allocator, GetActiveTypes());
}